

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O3

void __thiscall FlowInfo::xrefInlinedBranch(FlowInfo *this,PcodeOp *op)

{
  pointer *pppPVar1;
  OpCode OVar2;
  iterator __position;
  JumpTable *pJVar3;
  PcodeOp *local_18;
  
  OVar2 = op->opcode->opcode;
  local_18 = op;
  if (OVar2 == CPUI_BRANCHIND) {
    pJVar3 = Funcdata::linkJumpTable(this->data,op);
    if (pJVar3 == (JumpTable *)0x0) {
      __position._M_current =
           (this->tablelist).super__Vector_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->tablelist).super__Vector_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<PcodeOp*,std::allocator<PcodeOp*>>::_M_realloc_insert<PcodeOp*const&>
                  ((vector<PcodeOp*,std::allocator<PcodeOp*>> *)&this->tablelist,__position,
                   &local_18);
      }
      else {
        *__position._M_current = op;
        pppPVar1 = &(this->tablelist).super__Vector_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
    }
  }
  else {
    if (OVar2 == CPUI_CALLIND) {
      setupCallindSpecs(this,op,true,(FuncCallSpecs *)0x0);
      return;
    }
    if (OVar2 == CPUI_CALL) {
      setupCallSpecs(this,op,(FuncCallSpecs *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void FlowInfo::xrefInlinedBranch(PcodeOp *op)

{
  if (op->code() == CPUI_CALL)
    setupCallSpecs(op,(FuncCallSpecs *)0);
  else if (op->code() == CPUI_CALLIND)
    setupCallindSpecs(op,true,(FuncCallSpecs *)0);
  else if (op->code() == CPUI_BRANCHIND) {
    JumpTable *jt = data.linkJumpTable(op);
    if (jt == (JumpTable *)0)
      tablelist.push_back(op); // Didn't recover a jumptable
  }
}